

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.h
# Opt level: O2

bool box_x_compare(shared_ptr<hittable> *a,shared_ptr<hittable> *b)

{
  bool bVar1;
  __shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  __shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  std::__shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_28,&a->super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_38,&b->super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>);
  bVar1 = box_compare((shared_ptr<hittable> *)&local_28,(shared_ptr<hittable> *)&_Stack_38,0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  return bVar1;
}

Assistant:

bool box_x_compare (const shared_ptr<hittable> a, const shared_ptr<hittable> b) {
    return box_compare(a, b, 0);
}